

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

bool SetupContext(FileTest *t,KeyMap *key_map,EVP_PKEY_CTX *ctx)

{
  EVP_PKEY_CTX *pEVar1;
  KeyMap *pKVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *__nptr;
  EVP_MD *pEVar6;
  uchar *data;
  size_type sVar7;
  pointer puVar8;
  string *psVar9;
  size_type sVar10;
  Message *pMVar11;
  mapped_type *this;
  allocator<char> local_2a1;
  string local_2a0;
  EVP_PKEY *local_280;
  EVP_PKEY *derive_peer_key;
  Message local_270;
  allocator<char> local_261;
  string local_260;
  undefined1 local_240 [8];
  string derive_peer;
  string local_218;
  unique_ptr<unsigned_char,_bssl::internal::Deleter> local_1f8;
  UniquePtr<uint8_t> buf;
  string local_1e8;
  undefined1 local_1c8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> label;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  EVP_MD *local_160;
  EVP_MD *digest_1;
  string local_150;
  allocator<char> local_129;
  string local_128;
  EVP_MD *local_108;
  EVP_MD *digest;
  string local_f8;
  byte local_d3;
  byte local_d2;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  int local_60 [2];
  int padding;
  allocator<char> local_49;
  string local_48;
  EVP_PKEY_CTX *local_28;
  EVP_PKEY_CTX *ctx_local;
  KeyMap *key_map_local;
  FileTest *t_local;
  
  local_28 = ctx;
  ctx_local = (EVP_PKEY_CTX *)key_map;
  key_map_local = (KeyMap *)t;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"RSAPadding",&local_49);
  bVar3 = FileTest::HasAttribute(t,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pKVar2 = key_map_local;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"RSAPadding",&local_81);
    psVar9 = FileTest::GetAttributeOrDie((FileTest *)pKVar2,&local_80);
    bVar4 = GetRSAPadding((FileTest *)pKVar2,local_60,psVar9);
    bVar3 = true;
    if (bVar4) {
      iVar5 = EVP_PKEY_CTX_set_rsa_padding(local_28,local_60[0]);
      bVar3 = iVar5 == 0;
    }
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    if (bVar3) {
      t_local._7_1_ = 0;
      goto LAB_00378f78;
    }
  }
  pKVar2 = key_map_local;
  std::allocator<char>::allocator();
  local_d2 = 0;
  local_d3 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"PSSSaltLength",&local_a9);
  bVar4 = FileTest::HasAttribute((FileTest *)pKVar2,&local_a8);
  pKVar2 = key_map_local;
  pEVar1 = local_28;
  bVar3 = false;
  if (bVar4) {
    std::allocator<char>::allocator();
    local_d2 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"PSSSaltLength",&local_d1);
    local_d3 = 1;
    FileTest::GetAttributeOrDie((FileTest *)pKVar2,&local_d0);
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar5 = atoi(__nptr);
    iVar5 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pEVar1,iVar5);
    bVar3 = iVar5 == 0;
  }
  if ((local_d3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if ((local_d2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_d1);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pKVar2 = key_map_local;
  if (bVar3) {
    t_local._7_1_ = 0;
    goto LAB_00378f78;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"MGF1Digest",(allocator<char> *)((long)&digest + 7));
  bVar3 = FileTest::HasAttribute((FileTest *)pKVar2,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&digest + 7));
  pKVar2 = key_map_local;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"MGF1Digest",&local_129)
    ;
    psVar9 = FileTest::GetAttributeOrDie((FileTest *)pKVar2,&local_128);
    pEVar6 = GetDigest((FileTest *)pKVar2,psVar9);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    if ((pEVar6 == (EVP_MD *)0x0) ||
       (local_108 = pEVar6, iVar5 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_28,pEVar6), iVar5 == 0)) {
      t_local._7_1_ = 0;
      goto LAB_00378f78;
    }
  }
  pKVar2 = key_map_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_150,"OAEPDigest",(allocator<char> *)((long)&digest_1 + 7));
  bVar3 = FileTest::HasAttribute((FileTest *)pKVar2,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)((long)&digest_1 + 7));
  pKVar2 = key_map_local;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"OAEPDigest",&local_181)
    ;
    psVar9 = FileTest::GetAttributeOrDie((FileTest *)pKVar2,&local_180);
    pEVar6 = GetDigest((FileTest *)pKVar2,psVar9);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    if ((pEVar6 == (EVP_MD *)0x0) ||
       (local_160 = pEVar6, iVar5 = EVP_PKEY_CTX_set_rsa_oaep_md(local_28,pEVar6), iVar5 == 0)) {
      t_local._7_1_ = 0;
      goto LAB_00378f78;
    }
  }
  pKVar2 = key_map_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"OAEPLabel",
             (allocator<char> *)
             ((long)&label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  bVar3 = FileTest::HasAttribute((FileTest *)pKVar2,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&label.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  if (bVar3) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    pKVar2 = key_map_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,"OAEPLabel",
               (allocator<char> *)
               ((long)&buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 7));
    bVar3 = FileTest::GetBytes((FileTest *)pKVar2,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,
                               &local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 7));
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
      puVar8 = (pointer)OPENSSL_memdup(data,sVar7);
      std::unique_ptr<unsigned_char,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&local_1f8,puVar8);
      bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_1f8);
      pEVar1 = local_28;
      if (bVar3) {
        puVar8 = std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::get(&local_1f8);
        sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
        iVar5 = EVP_PKEY_CTX_set0_rsa_oaep_label(pEVar1,puVar8,sVar7);
        if (iVar5 == 0) goto LAB_00378ac8;
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::release(&local_1f8);
        buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_ = 0;
      }
      else {
LAB_00378ac8:
        t_local._7_1_ = 0;
        buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_ = 1;
      }
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&local_1f8);
    }
    else {
      t_local._7_1_ = 0;
      buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_ = 1;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
    if ((int)buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != 0) goto LAB_00378f78;
  }
  pKVar2 = key_map_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"DerivePeer",
             (allocator<char> *)(derive_peer.field_2._M_local_buf + 0xf));
  bVar3 = FileTest::HasAttribute((FileTest *)pKVar2,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)(derive_peer.field_2._M_local_buf + 0xf));
  pKVar2 = key_map_local;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"DerivePeer",&local_261)
    ;
    psVar9 = FileTest::GetAttributeOrDie((FileTest *)pKVar2,&local_260);
    std::__cxx11::string::string((string *)local_240,(string *)psVar9);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
    sVar10 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
             ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                      *)ctx_local,(key_type *)local_240);
    if (sVar10 == 0) {
      testing::Message::Message(&local_270);
      pMVar11 = testing::Message::operator<<(&local_270,(char (*) [20])"Could not find key ");
      pMVar11 = testing::Message::operator<<
                          (pMVar11,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_240);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&derive_peer_key,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                 ,0x135,"Failed");
      testing::internal::AssertHelper::operator=((AssertHelper *)&derive_peer_key,pMVar11);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&derive_peer_key);
      testing::Message::~Message(&local_270);
      t_local._7_1_ = 0;
      buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>_>_>_>
                           *)ctx_local,(key_type *)local_240);
      local_280 = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(this);
      iVar5 = EVP_PKEY_derive_set_peer((EVP_PKEY_CTX *)local_28,local_280);
      if (iVar5 == 0) {
        t_local._7_1_ = 0;
        buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._0_4_ = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_240);
    if ((int)buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != 0) goto LAB_00378f78;
  }
  pKVar2 = key_map_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"DiffieHellmanPad",&local_2a1);
  bVar4 = FileTest::HasAttribute((FileTest *)pKVar2,&local_2a0);
  bVar3 = false;
  if (bVar4) {
    iVar5 = EVP_PKEY_CTX_set_dh_pad(local_28,1);
    bVar3 = iVar5 == 0;
  }
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  if (bVar3) {
    t_local._7_1_ = 0;
  }
  else {
    t_local._7_1_ = 1;
  }
LAB_00378f78:
  return (bool)(t_local._7_1_ & 1);
}

Assistant:

static bool SetupContext(FileTest *t, KeyMap *key_map, EVP_PKEY_CTX *ctx) {
  if (t->HasAttribute("RSAPadding")) {
    int padding;
    if (!GetRSAPadding(t, &padding, t->GetAttributeOrDie("RSAPadding")) ||
        !EVP_PKEY_CTX_set_rsa_padding(ctx, padding)) {
      return false;
    }
  }
  if (t->HasAttribute("PSSSaltLength") &&
      !EVP_PKEY_CTX_set_rsa_pss_saltlen(
          ctx, atoi(t->GetAttributeOrDie("PSSSaltLength").c_str()))) {
    return false;
  }
  if (t->HasAttribute("MGF1Digest")) {
    const EVP_MD *digest = GetDigest(t, t->GetAttributeOrDie("MGF1Digest"));
    if (digest == nullptr || !EVP_PKEY_CTX_set_rsa_mgf1_md(ctx, digest)) {
      return false;
    }
  }
  if (t->HasAttribute("OAEPDigest")) {
    const EVP_MD *digest = GetDigest(t, t->GetAttributeOrDie("OAEPDigest"));
    if (digest == nullptr || !EVP_PKEY_CTX_set_rsa_oaep_md(ctx, digest)) {
      return false;
    }
  }
  if (t->HasAttribute("OAEPLabel")) {
    std::vector<uint8_t> label;
    if (!t->GetBytes(&label, "OAEPLabel")) {
      return false;
    }
    // For historical reasons, |EVP_PKEY_CTX_set0_rsa_oaep_label| expects to be
    // take ownership of the input.
    bssl::UniquePtr<uint8_t> buf(reinterpret_cast<uint8_t *>(
        OPENSSL_memdup(label.data(), label.size())));
    if (!buf ||
        !EVP_PKEY_CTX_set0_rsa_oaep_label(ctx, buf.get(), label.size())) {
      return false;
    }
    buf.release();
  }
  if (t->HasAttribute("DerivePeer")) {
    std::string derive_peer = t->GetAttributeOrDie("DerivePeer");
    if (key_map->count(derive_peer) == 0) {
      ADD_FAILURE() << "Could not find key " << derive_peer;
      return false;
    }
    EVP_PKEY *derive_peer_key = (*key_map)[derive_peer].get();
    if (!EVP_PKEY_derive_set_peer(ctx, derive_peer_key)) {
      return false;
    }
  }
  if (t->HasAttribute("DiffieHellmanPad") && !EVP_PKEY_CTX_set_dh_pad(ctx, 1)) {
    return false;
  }
  return true;
}